

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeClassFunctionElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  IntrusiveList<ExprBase> *this;
  SynBase *pSVar1;
  Lexeme *begin;
  Lexeme *end;
  char *pcVar2;
  char *pcVar3;
  IntrusiveList<TypeHandle> arguments_00;
  int iVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  TypeBase *returnType;
  undefined4 extraout_var_00;
  SynFunctionDefinition *pSVar6;
  TypeFunction *pTVar7;
  SynIdentifier *pSVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TypeHandle *node;
  SynError *error;
  SynAccessor *pSVar9;
  SynError *error_1;
  SynClassStaticIf *syntax_00;
  InplaceStr name;
  IntrusiveList<TypeHandle> argTypes;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynBase> expressions_1;
  IntrusiveList<SynFunctionArgument> arguments;
  SynBase *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_07;
  
  pSVar6 = (syntax->functions).head;
  this = &classDefinition->functions;
  while (pSVar6 != (SynFunctionDefinition *)0x0) {
    pEVar5 = AnalyzeFunctionDefinition
                       (ctx,pSVar6,(FunctionData *)0x0,(TypeFunction *)0x0,(TypeBase *)0x0,
                        (IntrusiveList<MatchData>)ZEXT816(0),false,false,true);
    IntrusiveList<ExprBase>::push_back(this,pEVar5);
    pSVar6 = (SynFunctionDefinition *)(pSVar6->super_SynBase).next;
    if ((pSVar6 == (SynFunctionDefinition *)0x0) || ((pSVar6->super_SynBase).typeID != 0x37)) {
      pSVar6 = (SynFunctionDefinition *)0x0;
    }
  }
  pSVar9 = (syntax->accessors).head;
  while (pSVar9 != (SynAccessor *)0x0) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this_00 = (SynBase *)CONCAT44(extraout_var,iVar4);
    pcVar2 = (classDefinition->classType->super_TypeStruct).super_TypeBase.name.begin;
    pcVar3 = (classDefinition->classType->super_TypeStruct).super_TypeBase.name.end;
    argTypes.head._0_4_ = SUB84(pcVar2,0);
    argTypes.head._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
    argTypes.tail._0_4_ = SUB84(pcVar3,0);
    argTypes.tail._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
    SynBase::SynBase(this_00,7,(pSVar9->super_SynBase).begin,(pSVar9->super_SynBase).end);
    this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e3d00;
    this_00[1]._vptr_SynBase = (_func_int **)0x0;
    *(undefined8 *)&this_00[1].typeID = 0;
    this_00[1].begin = (Lexeme *)CONCAT44(argTypes.head._4_4_,argTypes.head._0_4_);
    this_00[1].end = (Lexeme *)CONCAT44(argTypes.tail._4_4_,argTypes.tail._0_4_);
    returnType = AnalyzeType(ctx,pSVar9->type,true,(bool *)0x0);
    pSVar1 = pSVar9->getBlock;
    if ((pSVar1 != (SynBase *)0x0) && ((returnType == (TypeBase *)0x0 || (returnType->typeID != 0)))
       ) {
      expressions.head = (SynBase *)0x0;
      expressions.tail = (SynBase *)0x0;
      if (pSVar1->typeID == 0) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        SynError::SynError((SynError *)CONCAT44(extraout_var_00,iVar4),pSVar1->begin,pSVar1->end);
        IntrusiveList<SynBase>::push_back(&expressions,(SynBase *)CONCAT44(extraout_var_00,iVar4));
      }
      else if (pSVar1->typeID == 0x26) {
        expressions.head = (SynBase *)pSVar1[1]._vptr_SynBase;
        expressions.tail = *(SynBase **)&pSVar1[1].typeID;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
      pSVar6 = (SynFunctionDefinition *)CONCAT44(extraout_var_01,iVar4);
      pSVar1 = pSVar9->type;
      pSVar8 = pSVar9->name;
      argTypes.head._0_4_ = SUB84(expressions.head,0);
      argTypes.head._4_4_ = (undefined4)((ulong)expressions.head >> 0x20);
      argTypes.tail._0_4_ = SUB84(expressions.tail,0);
      argTypes.tail._4_4_ = (undefined4)((ulong)expressions.tail >> 0x20);
      SynBase::SynBase((SynBase *)pSVar6,0x37,(pSVar9->super_SynBase).begin,
                       (pSVar9->super_SynBase).end);
      (pSVar6->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e3d70;
      *(undefined2 *)&(pSVar6->super_SynBase).field_0x3a = 0;
      pSVar6->parentType = this_00;
      pSVar6->accessor = true;
      pSVar6->returnType = pSVar1;
      pSVar6->isOperator = false;
      pSVar6->name = pSVar8;
      (pSVar6->aliases).head = (SynIdentifier *)0x0;
      (pSVar6->aliases).tail = (SynIdentifier *)0x0;
      (pSVar6->arguments).head = (SynFunctionArgument *)0x0;
      (pSVar6->arguments).tail = (SynFunctionArgument *)0x0;
      (pSVar6->expressions).head = (SynBase *)CONCAT44(argTypes.head._4_4_,argTypes.head._0_4_);
      (pSVar6->expressions).tail = (SynBase *)CONCAT44(argTypes.tail._4_4_,argTypes.tail._0_4_);
      pTVar7 = ExpressionContext::GetFunctionType
                         (ctx,&syntax->super_SynBase,returnType,
                          (IntrusiveList<TypeHandle>)ZEXT816(0));
      pEVar5 = AnalyzeFunctionDefinition
                         (ctx,pSVar6,(FunctionData *)0x0,pTVar7,(TypeBase *)0x0,
                          (IntrusiveList<MatchData>)ZEXT816(0),false,false,false);
      if ((pEVar5 != (ExprBase *)0x0) && (pEVar5->typeID == 0x24)) {
        returnType = *(TypeBase **)(pEVar5[1]._vptr_ExprBase[5] + 0x60);
      }
      IntrusiveList<ExprBase>::push_back(this,pEVar5);
    }
    if ((pSVar9->setBlock != (SynBase *)0x0) &&
       ((returnType == (TypeBase *)0x0 || (returnType->typeID != 0)))) {
      arguments.head = (SynFunctionArgument *)0x0;
      arguments.tail = (SynFunctionArgument *)0x0;
      pSVar8 = pSVar9->setName;
      if (pSVar8 == (SynIdentifier *)0x0) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar8 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar4);
        name.end = "";
        name.begin = "r";
        SynIdentifier::SynIdentifier(pSVar8,name);
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      SynFunctionArgument::SynFunctionArgument
                ((SynFunctionArgument *)CONCAT44(extraout_var_03,iVar4),
                 (pSVar9->super_SynBase).begin,(pSVar9->super_SynBase).end,false,pSVar9->type,pSVar8
                 ,(SynBase *)0x0);
      IntrusiveList<SynFunctionArgument>::push_back
                (&arguments,(SynFunctionArgument *)CONCAT44(extraout_var_03,iVar4));
      expressions_1.head = (SynBase *)0x0;
      expressions_1.tail = (SynBase *)0x0;
      pSVar1 = pSVar9->setBlock;
      if (pSVar1 != (SynBase *)0x0) {
        if (pSVar1->typeID == 0) {
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          SynError::SynError((SynError *)CONCAT44(extraout_var_04,iVar4),pSVar1->begin,pSVar1->end);
          IntrusiveList<SynBase>::push_back
                    (&expressions_1,(SynBase *)CONCAT44(extraout_var_04,iVar4));
        }
        else if (pSVar1->typeID == 0x26) {
          expressions_1.head = (SynBase *)pSVar1[1]._vptr_SynBase;
          expressions_1.tail = *(SynBase **)&pSVar1[1].typeID;
        }
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
      pSVar6 = (SynFunctionDefinition *)CONCAT44(extraout_var_05,iVar4);
      begin = (pSVar9->super_SynBase).begin;
      end = (pSVar9->super_SynBase).end;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      SynTypeAuto::SynTypeAuto
                ((SynTypeAuto *)CONCAT44(extraout_var_06,iVar4),(pSVar9->super_SynBase).begin,
                 (pSVar9->super_SynBase).end);
      pSVar8 = pSVar9->name;
      expressions.head = &(arguments.head)->super_SynBase;
      expressions.tail = &(arguments.tail)->super_SynBase;
      argTypes.head._0_4_ = SUB84(expressions_1.head,0);
      argTypes.head._4_4_ = (undefined4)((ulong)expressions_1.head >> 0x20);
      argTypes.tail._0_4_ = SUB84(expressions_1.tail,0);
      argTypes.tail._4_4_ = (undefined4)((ulong)expressions_1.tail >> 0x20);
      SynBase::SynBase((SynBase *)pSVar6,0x37,begin,end);
      (pSVar6->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e3d70;
      *(undefined2 *)&(pSVar6->super_SynBase).field_0x3a = 0;
      pSVar6->parentType = this_00;
      pSVar6->accessor = true;
      pSVar6->returnType = (SynBase *)CONCAT44(extraout_var_06,iVar4);
      pSVar6->isOperator = false;
      pSVar6->name = pSVar8;
      (pSVar6->aliases).head = (SynIdentifier *)0x0;
      (pSVar6->aliases).tail = (SynIdentifier *)0x0;
      (pSVar6->arguments).head = (SynFunctionArgument *)expressions.head;
      (pSVar6->arguments).tail = (SynFunctionArgument *)expressions.tail;
      *(undefined4 *)&(pSVar6->expressions).head = argTypes.head._0_4_;
      *(undefined4 *)((long)&(pSVar6->expressions).head + 4) = argTypes.head._4_4_;
      *(undefined4 *)&(pSVar6->expressions).tail = argTypes.tail._0_4_;
      *(undefined4 *)((long)&(pSVar6->expressions).tail + 4) = argTypes.tail._4_4_;
      argTypes.head._0_4_ = 0;
      argTypes.head._4_4_ = 0;
      argTypes.tail._0_4_ = 0;
      argTypes.tail._4_4_ = 0;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      node = (TypeHandle *)CONCAT44(extraout_var_07,iVar4);
      node->type = returnType;
      node->next = (TypeHandle *)0x0;
      node->listed = false;
      IntrusiveList<TypeHandle>::push_back(&argTypes,node);
      arguments_00.head._4_4_ = argTypes.head._4_4_;
      arguments_00.head._0_4_ = argTypes.head._0_4_;
      arguments_00.tail._0_4_ = argTypes.tail._0_4_;
      arguments_00.tail._4_4_ = argTypes.tail._4_4_;
      pTVar7 = ExpressionContext::GetFunctionType
                         (ctx,&syntax->super_SynBase,ctx->typeAuto,arguments_00);
      pEVar5 = AnalyzeFunctionDefinition
                         (ctx,pSVar6,(FunctionData *)0x0,pTVar7,(TypeBase *)0x0,
                          (IntrusiveList<MatchData>)ZEXT816(0),false,false,false);
      IntrusiveList<ExprBase>::push_back(this,pEVar5);
    }
    pSVar9 = (SynAccessor *)(pSVar9->super_SynBase).next;
    if ((pSVar9 == (SynAccessor *)0x0) || ((pSVar9->super_SynBase).typeID != 0x35)) {
      pSVar9 = (SynAccessor *)0x0;
    }
  }
  syntax_00 = (syntax->staticIfs).head;
  while (syntax_00 != (SynClassStaticIf *)0x0) {
    AnalyzeClassStaticIf(ctx,classDefinition,syntax_00,false);
    syntax_00 = (SynClassStaticIf *)(syntax_00->super_SynBase).next;
    if ((syntax_00 == (SynClassStaticIf *)0x0) || ((syntax_00->super_SynBase).typeID != 0x3d)) {
      syntax_00 = (SynClassStaticIf *)0x0;
    }
  }
  return;
}

Assistant:

void AnalyzeClassFunctionElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	for(SynFunctionDefinition *function = syntax->functions.head; function; function = getType<SynFunctionDefinition>(function->next))
		classDefinition->functions.push_back(AnalyzeFunctionDefinition(ctx, function, NULL, NULL, NULL, IntrusiveList<MatchData>(), false, false, true));

	for(SynAccessor *accessor = syntax->accessors.head; accessor; accessor = getType<SynAccessor>(accessor->next))
	{
		SynBase *parentType = new (ctx.get<SynTypeSimple>()) SynTypeSimple(accessor->begin, accessor->end, IntrusiveList<SynIdentifier>(), classDefinition->classType->name);

		TypeBase *accessorType = AnalyzeType(ctx, accessor->type);

		if(accessor->getBlock && !isType<TypeError>(accessorType))
		{
			IntrusiveList<SynIdentifier> aliases;
			IntrusiveList<SynFunctionArgument> arguments;

			IntrusiveList<SynBase> expressions;

			if(SynBlock *block = getType<SynBlock>(accessor->getBlock))
				expressions = block->expressions;
			else if(SynError *error = getType<SynError>(accessor->getBlock))
				expressions.push_back(new (ctx.get<SynError>()) SynError(error->begin, error->end));

			SynFunctionDefinition *function = new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(accessor->begin, accessor->end, false, false, parentType, true, accessor->type, false, accessor->name, aliases, arguments, expressions);

			TypeFunction *instance = ctx.GetFunctionType(syntax, accessorType, IntrusiveList<TypeHandle>());

			ExprBase *definition = AnalyzeFunctionDefinition(ctx, function, NULL, instance, NULL, IntrusiveList<MatchData>(), false, false, false);

			if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(definition))
				accessorType = node->function->type->returnType;

			classDefinition->functions.push_back(definition);
		}

		if(accessor->setBlock && !isType<TypeError>(accessorType))
		{
			IntrusiveList<SynIdentifier> aliases;

			IntrusiveList<SynFunctionArgument> arguments;

			SynIdentifier *setName = accessor->setName;

			if(!setName)
				setName = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("r"));

			arguments.push_back(new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(accessor->begin, accessor->end, false, accessor->type, setName, NULL));

			IntrusiveList<SynBase> expressions;

			if(SynBlock *block = getType<SynBlock>(accessor->setBlock))
				expressions = block->expressions;
			else if(SynError *error = getType<SynError>(accessor->setBlock))
				expressions.push_back(new (ctx.get<SynError>()) SynError(error->begin, error->end));

			SynFunctionDefinition *function = new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(accessor->begin, accessor->end, false, false, parentType, true, new (ctx.get<SynTypeAuto>()) SynTypeAuto(accessor->begin, accessor->end), false, accessor->name, aliases, arguments, expressions);

			IntrusiveList<TypeHandle> argTypes;
			argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(accessorType));

			TypeFunction *instance = ctx.GetFunctionType(syntax, ctx.typeAuto, argTypes);

			classDefinition->functions.push_back(AnalyzeFunctionDefinition(ctx, function, NULL, instance, NULL, IntrusiveList<MatchData>(), false, false, false));
		}
	}

	for(SynClassStaticIf *staticIf = syntax->staticIfs.head; staticIf; staticIf = getType<SynClassStaticIf>(staticIf->next))
		AnalyzeClassStaticIf(ctx, classDefinition, staticIf, false);
}